

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O0

void __thiscall CFG::dumpDOT(CFG *this,string *fileName)

{
  byte bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined1 local_270 [40];
  string local_248 [48];
  ostream local_218 [8];
  ofstream fout;
  string *fileName_local;
  CFG *this_local;
  
  std::ofstream::ofstream(local_218,(string *)fileName,_S_out);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 0) {
    local_270[0x26] = 1;
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            __cxa_allocate_exception(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_248,"Unable to write file: ",(allocator *)(local_270 + 0x27))
    ;
    std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_248);
    local_270[0x26] = 0;
    __cxa_throw(__lhs,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  toDOT_abi_cxx11_((CFG *)local_270);
  std::operator<<(local_218,(string *)local_270);
  std::__cxx11::string::~string((string *)local_270);
  std::ofstream::close();
  std::ofstream::~ofstream(local_218);
  return;
}

Assistant:

void CFG::dumpDOT(const std::string& fileName) {
	std::ofstream fout(fileName);
	if (!fout.is_open())
		throw std::string("Unable to write file: ") + fileName;

	fout << this->toDOT();
	fout.close();
}